

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_draw_list_add_clip(nk_draw_list *list,nk_rect rect)

{
  int *piVar1;
  nk_handle *pnVar2;
  
  if (list != (nk_draw_list *)0x0) {
    if (list->cmd_count == 0) {
      pnVar2 = &(list->config).null.texture;
    }
    else {
      piVar1 = (int *)((long)(list->buffer->memory).ptr +
                      (ulong)(list->cmd_count - 1) * -0x20 +
                      ((list->buffer->memory).size - list->cmd_offset));
      if (*piVar1 == 0) {
        *(nk_rect *)(piVar1 + 1) = rect;
      }
      pnVar2 = (nk_handle *)(piVar1 + 6);
    }
    nk_draw_list_push_command(list,rect,*pnVar2);
    return;
  }
  return;
}

Assistant:

NK_INTERN void
nk_draw_list_add_clip(struct nk_draw_list *list, struct nk_rect rect)
{
NK_ASSERT(list);
if (!list) return;
if (!list->cmd_count) {
nk_draw_list_push_command(list, rect, list->config.null.texture);
} else {
struct nk_draw_command *prev = nk_draw_list_command_last(list);
if (prev->elem_count == 0)
prev->clip_rect = rect;
nk_draw_list_push_command(list, rect, prev->texture);
}
}